

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_audio_buffer_ref_read_pcm_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,void *pFramesOut,ma_uint64 frameCount,
                    ma_bool32 loop)

{
  int iVar1;
  ma_uint32 mVar2;
  ulong uVar3;
  void *src;
  int in_ECX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  ma_uint64 framesToRead;
  ma_uint64 framesRemaining;
  ma_uint64 framesAvailable;
  ma_uint64 totalFramesRead;
  long lVar4;
  ma_uint64 frameCount_00;
  void *dst;
  undefined8 local_58;
  undefined8 local_40;
  undefined8 local_18;
  
  local_40 = 0;
  if (in_RDI == 0) {
    local_18 = 0;
  }
  else if (in_RDX == 0) {
    local_18 = 0;
  }
  else {
    while (local_40 < in_RDX) {
      uVar3 = *(long *)(in_RDI + 0x60) - *(long *)(in_RDI + 0x58);
      local_58 = in_RDX - local_40;
      if (uVar3 < in_RDX - local_40) {
        local_58 = uVar3;
      }
      if (in_RSI != 0) {
        iVar1 = *(int *)(in_RDI + 0x4c);
        lVar4 = in_RSI;
        mVar2 = ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x48));
        src = (void *)(lVar4 + local_40 * (mVar2 * iVar1));
        frameCount_00 = *(ma_uint64 *)(in_RDI + 0x68);
        dst = *(void **)(in_RDI + 0x58);
        ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x48));
        ma_copy_pcm_frames(dst,src,frameCount_00,(ma_format)((ulong)lVar4 >> 0x20),(ma_uint32)lVar4)
        ;
      }
      local_40 = local_58 + local_40;
      *(ulong *)(in_RDI + 0x58) = local_58 + *(long *)(in_RDI + 0x58);
      if (*(long *)(in_RDI + 0x58) == *(long *)(in_RDI + 0x60)) {
        if (in_ECX == 0) break;
        *(undefined8 *)(in_RDI + 0x58) = 0;
      }
    }
    local_18 = local_40;
  }
  return local_18;
}

Assistant:

MA_API ma_uint64 ma_audio_buffer_ref_read_pcm_frames(ma_audio_buffer_ref* pAudioBufferRef, void* pFramesOut, ma_uint64 frameCount, ma_bool32 loop)
{
    ma_uint64 totalFramesRead = 0;

    if (pAudioBufferRef == NULL) {
        return 0;
    }

    if (frameCount == 0) {
        return 0;
    }

    while (totalFramesRead < frameCount) {
        ma_uint64 framesAvailable = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
        ma_uint64 framesRemaining = frameCount - totalFramesRead;
        ma_uint64 framesToRead;

        framesToRead = framesRemaining;
        if (framesToRead > framesAvailable) {
            framesToRead = framesAvailable;
        }

        if (pFramesOut != NULL) {
            ma_copy_pcm_frames(ma_offset_ptr(pFramesOut, totalFramesRead * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels)), ma_offset_ptr(pAudioBufferRef->pData, pAudioBufferRef->cursor * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels)), framesToRead, pAudioBufferRef->format, pAudioBufferRef->channels);
        }

        totalFramesRead += framesToRead;

        pAudioBufferRef->cursor += framesToRead;
        if (pAudioBufferRef->cursor == pAudioBufferRef->sizeInFrames) {
            if (loop) {
                pAudioBufferRef->cursor = 0;
            } else {
                break;  /* We've reached the end and we're not looping. Done. */
            }
        }

        MA_ASSERT(pAudioBufferRef->cursor < pAudioBufferRef->sizeInFrames);
    }

    return totalFramesRead;
}